

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O0

void __thiscall
flatbuffers::cpp::CppGenerator::GenCopyCtorAssignOpDefs(CppGenerator *this,StructDef *struct_def)

{
  long lVar1;
  bool bVar2;
  vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *this_00;
  Value *pVVar3;
  ulong uVar4;
  bool local_fcb;
  bool local_fca;
  bool local_f62;
  bool local_f61;
  allocator<char> local_f21;
  string local_f20;
  allocator<char> local_ef9;
  string local_ef8;
  allocator<char> local_ed1;
  string local_ed0;
  allocator<char> local_ea9;
  string local_ea8;
  allocator<char> local_e81;
  string local_e80;
  allocator<char> local_e59;
  string local_e58;
  allocator<char> local_e31;
  string local_e30;
  allocator<char> local_e09;
  string local_e08;
  string local_de8;
  string local_dc8;
  allocator<char> local_da1;
  string local_da0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d60;
  string local_d40;
  allocator<char> local_d19;
  string local_d18;
  string local_cf8;
  allocator<char> local_cd1;
  string local_cd0;
  string local_cb0;
  undefined1 local_c90 [8];
  CodeWriter cw_3;
  allocator<char> local_a89;
  string local_a88;
  string local_a68;
  allocator<char> local_a41;
  string local_a40;
  string local_a20;
  undefined1 local_a00 [8];
  CodeWriter cw_2;
  allocator<char> local_7f9;
  string local_7f8;
  string local_7d8;
  allocator<char> local_7b1;
  string local_7b0;
  allocator<char> local_789;
  string local_788;
  allocator<char> local_761;
  string local_760;
  string local_740;
  allocator<char> local_719;
  string local_718;
  allocator<char> local_6f1;
  string local_6f0;
  undefined1 local_6d0 [8];
  CodeWriter cw_1;
  undefined1 local_4e8 [7];
  bool is_ptr_1;
  string *local_4c8;
  string *type_name_1;
  string local_4b8;
  Value *local_498;
  Value *cpp_ptr_type_1;
  string local_488;
  Value *local_468;
  Value *cpp_type_1;
  Type vec_type;
  allocator<char> local_419;
  string local_418;
  string local_3f8;
  allocator<char> local_3d1;
  string local_3d0;
  allocator<char> local_3a9;
  string local_3a8;
  string local_388;
  allocator<char> local_361;
  string local_360;
  string local_340;
  undefined1 local_320 [8];
  CodeWriter cw;
  undefined1 local_138 [7];
  bool is_ptr;
  string *local_118;
  string *type_name;
  string local_108;
  Value *local_e8;
  Value *cpp_ptr_type;
  string local_d8;
  Value *local_b8;
  Value *cpp_type;
  Type *local_a0;
  Type *type;
  FieldDef **field;
  const_iterator __end2;
  const_iterator __begin2;
  vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *__range2;
  string swaps;
  string vector_copies;
  string initializer_list;
  StructDef *struct_def_local;
  CppGenerator *this_local;
  
  if ((0 < *(int *)&(this->opts_).super_IDLOptions.field_0x30c) &&
     (bVar2 = NeedsCopyCtorAssignOp(this,struct_def), bVar2)) {
    std::__cxx11::string::string((string *)(vector_copies.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)(swaps.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)&__range2);
    this_00 = &(struct_def->fields).vec;
    __end2 = std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::begin
                       (this_00);
    field = (FieldDef **)
            std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::end
                      (this_00);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
                                       *)&field), bVar2) {
      type = (Type *)__gnu_cxx::
                     __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
                     ::operator*(&__end2);
      local_a0 = &((*(FieldDef **)type)->value).type;
      if ((((*(FieldDef **)type)->deprecated & 1U) == 0) &&
         ((((Value *)local_a0)->type).base_type != BASE_TYPE_UTYPE)) {
        if ((((Value *)local_a0)->type).base_type == BASE_TYPE_STRUCT) {
          uVar4 = std::__cxx11::string::empty();
          if ((uVar4 & 1) == 0) {
            std::__cxx11::string::operator+=
                      ((string *)(vector_copies.field_2._M_local_buf + 8),",\n        ");
          }
          lVar1 = *(long *)type;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_d8,"cpp_type",(allocator<char> *)((long)&cpp_ptr_type + 7));
          pVVar3 = SymbolTable<flatbuffers::Value>::Lookup
                             ((SymbolTable<flatbuffers::Value> *)(lVar1 + 0x58),&local_d8);
          std::__cxx11::string::~string((string *)&local_d8);
          std::allocator<char>::~allocator((allocator<char> *)((long)&cpp_ptr_type + 7));
          lVar1 = *(long *)type;
          local_b8 = pVVar3;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_108,"cpp_ptr_type",(allocator<char> *)((long)&type_name + 7));
          pVVar3 = SymbolTable<flatbuffers::Value>::Lookup
                             ((SymbolTable<flatbuffers::Value> *)(lVar1 + 0x58),&local_108);
          std::__cxx11::string::~string((string *)&local_108);
          std::allocator<char>::~allocator((allocator<char> *)((long)&type_name + 7));
          local_e8 = pVVar3;
          if (local_b8 == (Value *)0x0) {
            GenTypeNative_abi_cxx11_
                      ((string *)local_138,this,local_a0,false,*(FieldDef **)type,true);
          }
          else {
            std::__cxx11::string::string((string *)local_138,(string *)&local_b8->constant);
          }
          local_118 = (string *)local_138;
          bVar2 = IsStruct(local_a0);
          local_f61 = true;
          if ((bVar2) && (local_f61 = true, (*(byte *)(*(long *)type + 0x113) & 1) != 0)) {
            local_f62 = false;
            if (local_b8 != (Value *)0x0) {
              local_f62 = std::operator!=(&local_e8->constant,"naked");
            }
            local_f61 = local_f62;
          }
          cw._479_1_ = local_f61;
          std::__cxx11::string::string((string *)&local_340);
          CodeWriter::CodeWriter((CodeWriter *)local_320,&local_340);
          std::__cxx11::string::~string((string *)&local_340);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_360,"FIELD",&local_361);
          Name_abi_cxx11_(&local_388,this,*(FieldDef **)type);
          CodeWriter::SetValue((CodeWriter *)local_320,&local_360,&local_388);
          std::__cxx11::string::~string((string *)&local_388);
          std::__cxx11::string::~string((string *)&local_360);
          std::allocator<char>::~allocator(&local_361);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_3a8,"TYPE",&local_3a9)
          ;
          CodeWriter::SetValue((CodeWriter *)local_320,&local_3a8,local_118);
          std::__cxx11::string::~string((string *)&local_3a8);
          std::allocator<char>::~allocator(&local_3a9);
          if ((cw._479_1_ & 1) == 0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_418,"{{FIELD}}(o.{{FIELD}})\\",&local_419);
            CodeWriter::operator+=((CodeWriter *)local_320,&local_418);
            std::__cxx11::string::~string((string *)&local_418);
            std::allocator<char>::~allocator(&local_419);
            CodeWriter::ToString_abi_cxx11_
                      ((string *)&vec_type.fixed_length,(CodeWriter *)local_320);
            std::__cxx11::string::operator+=
                      ((string *)(vector_copies.field_2._M_local_buf + 8),
                       (string *)&vec_type.fixed_length);
            std::__cxx11::string::~string((string *)&vec_type.fixed_length);
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_3d0,
                       "{{FIELD}}((o.{{FIELD}}) ? new {{TYPE}}(*o.{{FIELD}}) : nullptr)\\",
                       &local_3d1);
            CodeWriter::operator+=((CodeWriter *)local_320,&local_3d0);
            std::__cxx11::string::~string((string *)&local_3d0);
            std::allocator<char>::~allocator(&local_3d1);
            CodeWriter::ToString_abi_cxx11_(&local_3f8,(CodeWriter *)local_320);
            std::__cxx11::string::operator+=
                      ((string *)(vector_copies.field_2._M_local_buf + 8),(string *)&local_3f8);
            std::__cxx11::string::~string((string *)&local_3f8);
          }
          CodeWriter::~CodeWriter((CodeWriter *)local_320);
          std::__cxx11::string::~string((string *)local_138);
        }
        else {
          bVar2 = IsVector(local_a0);
          if (bVar2) {
            Type::VectorType((Type *)&cpp_type_1,local_a0);
            if ((int)cpp_type_1 == 1) goto LAB_0020fdd6;
            lVar1 = *(long *)type;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_488,"cpp_type",
                       (allocator<char> *)((long)&cpp_ptr_type_1 + 7));
            pVVar3 = SymbolTable<flatbuffers::Value>::Lookup
                               ((SymbolTable<flatbuffers::Value> *)(lVar1 + 0x58),&local_488);
            std::__cxx11::string::~string((string *)&local_488);
            std::allocator<char>::~allocator((allocator<char> *)((long)&cpp_ptr_type_1 + 7));
            lVar1 = *(long *)type;
            local_468 = pVVar3;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_4b8,"cpp_ptr_type",
                       (allocator<char> *)((long)&type_name_1 + 7));
            pVVar3 = SymbolTable<flatbuffers::Value>::Lookup
                               ((SymbolTable<flatbuffers::Value> *)(lVar1 + 0x58),&local_4b8);
            std::__cxx11::string::~string((string *)&local_4b8);
            std::allocator<char>::~allocator((allocator<char> *)((long)&type_name_1 + 7));
            local_498 = pVVar3;
            if (local_468 == (Value *)0x0) {
              GenTypeNative_abi_cxx11_
                        ((string *)local_4e8,this,(Type *)&cpp_type_1,true,*(FieldDef **)type,true);
            }
            else {
              std::__cxx11::string::string((string *)local_4e8,(string *)&local_468->constant);
            }
            local_4c8 = (string *)local_4e8;
            bVar2 = IsVectorOfPointers(*(FieldDef **)type);
            local_fca = true;
            if (!bVar2) {
              local_fcb = false;
              if (local_468 != (Value *)0x0) {
                local_fcb = std::operator!=(&local_498->constant,"naked");
              }
              local_fca = local_fcb;
            }
            cw_1._479_1_ = local_fca;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>((string *)&local_6f0,"  ",&local_6f1)
            ;
            CodeWriter::CodeWriter((CodeWriter *)local_6d0,&local_6f0);
            std::__cxx11::string::~string((string *)&local_6f0);
            std::allocator<char>::~allocator(&local_6f1);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_718,"FIELD",&local_719);
            Name_abi_cxx11_(&local_740,this,*(FieldDef **)type);
            CodeWriter::SetValue((CodeWriter *)local_6d0,&local_718,&local_740);
            std::__cxx11::string::~string((string *)&local_740);
            std::__cxx11::string::~string((string *)&local_718);
            std::allocator<char>::~allocator(&local_719);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_760,"TYPE",&local_761);
            CodeWriter::SetValue((CodeWriter *)local_6d0,&local_760,local_4c8);
            std::__cxx11::string::~string((string *)&local_760);
            std::allocator<char>::~allocator(&local_761);
            if ((cw_1._479_1_ & 1) == 0) {
              uVar4 = std::__cxx11::string::empty();
              if ((uVar4 & 1) == 0) {
                std::__cxx11::string::operator+=
                          ((string *)(vector_copies.field_2._M_local_buf + 8),",\n        ");
              }
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_7f8,"{{FIELD}}(o.{{FIELD}})\\",&local_7f9);
              CodeWriter::operator+=((CodeWriter *)local_6d0,&local_7f8);
              std::__cxx11::string::~string((string *)&local_7f8);
              std::allocator<char>::~allocator(&local_7f9);
              CodeWriter::ToString_abi_cxx11_
                        ((string *)&cw_2.cur_ident_lvl_,(CodeWriter *)local_6d0);
              std::__cxx11::string::operator+=
                        ((string *)(vector_copies.field_2._M_local_buf + 8),
                         (string *)&cw_2.cur_ident_lvl_);
              std::__cxx11::string::~string((string *)&cw_2.cur_ident_lvl_);
            }
            else {
              CodeWriter::IncrementIdentLevel((CodeWriter *)local_6d0);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_788,"{{FIELD}}.reserve(o.{{FIELD}}.size());",&local_789);
              CodeWriter::operator+=((CodeWriter *)local_6d0,&local_788);
              std::__cxx11::string::~string((string *)&local_788);
              std::allocator<char>::~allocator(&local_789);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_7b0,
                         "for (const auto &{{FIELD}}_ : o.{{FIELD}}) { {{FIELD}}.emplace_back(({{FIELD}}_) ? new {{TYPE}}(*{{FIELD}}_) : nullptr); }"
                         ,&local_7b1);
              CodeWriter::operator+=((CodeWriter *)local_6d0,&local_7b0);
              std::__cxx11::string::~string((string *)&local_7b0);
              std::allocator<char>::~allocator(&local_7b1);
              CodeWriter::ToString_abi_cxx11_(&local_7d8,(CodeWriter *)local_6d0);
              std::__cxx11::string::operator+=
                        ((string *)(swaps.field_2._M_local_buf + 8),(string *)&local_7d8);
              std::__cxx11::string::~string((string *)&local_7d8);
            }
            CodeWriter::~CodeWriter((CodeWriter *)local_6d0);
            std::__cxx11::string::~string((string *)local_4e8);
          }
          else {
            uVar4 = std::__cxx11::string::empty();
            if ((uVar4 & 1) == 0) {
              std::__cxx11::string::operator+=
                        ((string *)(vector_copies.field_2._M_local_buf + 8),",\n        ");
            }
            std::__cxx11::string::string((string *)&local_a20);
            CodeWriter::CodeWriter((CodeWriter *)local_a00,&local_a20);
            std::__cxx11::string::~string((string *)&local_a20);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_a40,"FIELD",&local_a41);
            Name_abi_cxx11_(&local_a68,this,*(FieldDef **)type);
            CodeWriter::SetValue((CodeWriter *)local_a00,&local_a40,&local_a68);
            std::__cxx11::string::~string((string *)&local_a68);
            std::__cxx11::string::~string((string *)&local_a40);
            std::allocator<char>::~allocator(&local_a41);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_a88,"{{FIELD}}(o.{{FIELD}})\\",&local_a89);
            CodeWriter::operator+=((CodeWriter *)local_a00,&local_a88);
            std::__cxx11::string::~string((string *)&local_a88);
            std::allocator<char>::~allocator(&local_a89);
            CodeWriter::ToString_abi_cxx11_((string *)&cw_3.cur_ident_lvl_,(CodeWriter *)local_a00);
            std::__cxx11::string::operator+=
                      ((string *)(vector_copies.field_2._M_local_buf + 8),
                       (string *)&cw_3.cur_ident_lvl_);
            std::__cxx11::string::~string((string *)&cw_3.cur_ident_lvl_);
            CodeWriter::~CodeWriter((CodeWriter *)local_a00);
          }
        }
        uVar4 = std::__cxx11::string::empty();
        if ((uVar4 & 1) == 0) {
          std::__cxx11::string::operator+=((string *)&__range2,"\n  ");
        }
        std::__cxx11::string::string((string *)&local_cb0);
        CodeWriter::CodeWriter((CodeWriter *)local_c90,&local_cb0);
        std::__cxx11::string::~string((string *)&local_cb0);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_cd0,"FIELD",&local_cd1);
        Name_abi_cxx11_(&local_cf8,this,*(FieldDef **)type);
        CodeWriter::SetValue((CodeWriter *)local_c90,&local_cd0,&local_cf8);
        std::__cxx11::string::~string((string *)&local_cf8);
        std::__cxx11::string::~string((string *)&local_cd0);
        std::allocator<char>::~allocator(&local_cd1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_d18,"std::swap({{FIELD}}, o.{{FIELD}});\\",&local_d19);
        CodeWriter::operator+=((CodeWriter *)local_c90,&local_d18);
        std::__cxx11::string::~string((string *)&local_d18);
        std::allocator<char>::~allocator(&local_d19);
        CodeWriter::ToString_abi_cxx11_(&local_d40,(CodeWriter *)local_c90);
        std::__cxx11::string::operator+=((string *)&__range2,(string *)&local_d40);
        std::__cxx11::string::~string((string *)&local_d40);
        CodeWriter::~CodeWriter((CodeWriter *)local_c90);
      }
LAB_0020fdd6:
      __gnu_cxx::
      __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
      ::operator++(&__end2);
    }
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      std::operator+(&local_d60,"\n      : ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&vector_copies.field_2 + 8));
      std::__cxx11::string::operator=
                ((string *)(vector_copies.field_2._M_local_buf + 8),(string *)&local_d60);
      std::__cxx11::string::~string((string *)&local_d60);
    }
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      std::operator+(&local_d80,"  ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range2)
      ;
      std::__cxx11::string::operator=((string *)&__range2,(string *)&local_d80);
      std::__cxx11::string::~string((string *)&local_d80);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_da0,"NATIVE_NAME",&local_da1);
    Name_abi_cxx11_(&local_de8,this,&struct_def->super_Definition);
    NativeName(&local_dc8,&local_de8,struct_def,&(this->opts_).super_IDLOptions);
    CodeWriter::SetValue(&this->code_,&local_da0,&local_dc8);
    std::__cxx11::string::~string((string *)&local_dc8);
    std::__cxx11::string::~string((string *)&local_de8);
    std::__cxx11::string::~string((string *)&local_da0);
    std::allocator<char>::~allocator(&local_da1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_e08,"INIT_LIST",&local_e09);
    CodeWriter::SetValue(&this->code_,&local_e08,(string *)((long)&vector_copies.field_2 + 8));
    std::__cxx11::string::~string((string *)&local_e08);
    std::allocator<char>::~allocator(&local_e09);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_e30,"VEC_COPY",&local_e31);
    CodeWriter::SetValue(&this->code_,&local_e30,(string *)((long)&swaps.field_2 + 8));
    std::__cxx11::string::~string((string *)&local_e30);
    std::allocator<char>::~allocator(&local_e31);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_e58,"SWAPS",&local_e59);
    CodeWriter::SetValue(&this->code_,&local_e58,(string *)&__range2);
    std::__cxx11::string::~string((string *)&local_e58);
    std::allocator<char>::~allocator(&local_e59);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e80,
               "inline {{NATIVE_NAME}}::{{NATIVE_NAME}}(const {{NATIVE_NAME}} &o){{INIT_LIST}} {",
               &local_e81);
    CodeWriter::operator+=(&this->code_,&local_e80);
    std::__cxx11::string::~string((string *)&local_e80);
    std::allocator<char>::~allocator(&local_e81);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_ea8,"{{VEC_COPY}}}\n",&local_ea9);
    CodeWriter::operator+=(&this->code_,&local_ea8);
    std::__cxx11::string::~string((string *)&local_ea8);
    std::allocator<char>::~allocator(&local_ea9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_ed0,
               "inline {{NATIVE_NAME}} &{{NATIVE_NAME}}::operator=({{NATIVE_NAME}} o) FLATBUFFERS_NOEXCEPT {"
               ,&local_ed1);
    CodeWriter::operator+=(&this->code_,&local_ed0);
    std::__cxx11::string::~string((string *)&local_ed0);
    std::allocator<char>::~allocator(&local_ed1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_ef8,"{{SWAPS}}",&local_ef9);
    CodeWriter::operator+=(&this->code_,&local_ef8);
    std::__cxx11::string::~string((string *)&local_ef8);
    std::allocator<char>::~allocator(&local_ef9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f20,"  return *this;\n}\n",&local_f21);
    CodeWriter::operator+=(&this->code_,&local_f20);
    std::__cxx11::string::~string((string *)&local_f20);
    std::allocator<char>::~allocator(&local_f21);
    std::__cxx11::string::~string((string *)&__range2);
    std::__cxx11::string::~string((string *)(swaps.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(vector_copies.field_2._M_local_buf + 8));
  }
  return;
}

Assistant:

void GenCopyCtorAssignOpDefs(const StructDef &struct_def) {
    if (opts_.g_cpp_std < cpp::CPP_STD_11) return;
    if (!NeedsCopyCtorAssignOp(struct_def)) return;
    std::string initializer_list;
    std::string vector_copies;
    std::string swaps;
    for (const auto &field : struct_def.fields.vec) {
      const auto &type = field->value.type;
      if (field->deprecated || type.base_type == BASE_TYPE_UTYPE) continue;
      if (type.base_type == BASE_TYPE_STRUCT) {
        if (!initializer_list.empty()) { initializer_list += ",\n        "; }
        const auto cpp_type = field->attributes.Lookup("cpp_type");
        const auto cpp_ptr_type = field->attributes.Lookup("cpp_ptr_type");
        const std::string &type_name =
            (cpp_type) ? cpp_type->constant
                       : GenTypeNative(type, /*invector*/ false, *field,
                                       /*forcopy*/ true);
        const bool is_ptr = !(IsStruct(type) && field->native_inline) ||
                            (cpp_type && cpp_ptr_type->constant != "naked");
        CodeWriter cw;
        cw.SetValue("FIELD", Name(*field));
        cw.SetValue("TYPE", type_name);
        if (is_ptr) {
          cw +=
              "{{FIELD}}((o.{{FIELD}}) ? new {{TYPE}}(*o.{{FIELD}}) : "
              "nullptr)\\";
          initializer_list += cw.ToString();
        } else {
          cw += "{{FIELD}}(o.{{FIELD}})\\";
          initializer_list += cw.ToString();
        }
      } else if (IsVector(type)) {
        const auto vec_type = type.VectorType();
        if (vec_type.base_type == BASE_TYPE_UTYPE) continue;
        const auto cpp_type = field->attributes.Lookup("cpp_type");
        const auto cpp_ptr_type = field->attributes.Lookup("cpp_ptr_type");
        const std::string &type_name =
            (cpp_type) ? cpp_type->constant
                       : GenTypeNative(vec_type, /*invector*/ true, *field,
                                       /*forcopy*/ true);
        const bool is_ptr = IsVectorOfPointers(*field) ||
                            (cpp_type && cpp_ptr_type->constant != "naked");
        CodeWriter cw("  ");
        cw.SetValue("FIELD", Name(*field));
        cw.SetValue("TYPE", type_name);
        if (is_ptr) {
          // Use emplace_back to construct the potentially-smart pointer element
          // from a raw pointer to a new-allocated copy.
          cw.IncrementIdentLevel();
          cw += "{{FIELD}}.reserve(o.{{FIELD}}.size());";
          cw +=
              "for (const auto &{{FIELD}}_ : o.{{FIELD}}) { "
              "{{FIELD}}.emplace_back(({{FIELD}}_) ? new {{TYPE}}(*{{FIELD}}_) "
              ": nullptr); }";
          vector_copies += cw.ToString();
        } else {
          // For non-pointer elements, use std::vector's copy constructor in the
          // initializer list. This will yield better performance than an insert
          // range loop for trivially-copyable element types.
          if (!initializer_list.empty()) { initializer_list += ",\n        "; }
          cw += "{{FIELD}}(o.{{FIELD}})\\";
          initializer_list += cw.ToString();
        }
      } else {
        if (!initializer_list.empty()) { initializer_list += ",\n        "; }
        CodeWriter cw;
        cw.SetValue("FIELD", Name(*field));
        cw += "{{FIELD}}(o.{{FIELD}})\\";
        initializer_list += cw.ToString();
      }
      {
        if (!swaps.empty()) { swaps += "\n  "; }
        CodeWriter cw;
        cw.SetValue("FIELD", Name(*field));
        cw += "std::swap({{FIELD}}, o.{{FIELD}});\\";
        swaps += cw.ToString();
      }
    }
    if (!initializer_list.empty()) {
      initializer_list = "\n      : " + initializer_list;
    }
    if (!swaps.empty()) { swaps = "  " + swaps; }

    code_.SetValue("NATIVE_NAME",
                   NativeName(Name(struct_def), &struct_def, opts_));
    code_.SetValue("INIT_LIST", initializer_list);
    code_.SetValue("VEC_COPY", vector_copies);
    code_.SetValue("SWAPS", swaps);

    code_ +=
        "inline {{NATIVE_NAME}}::{{NATIVE_NAME}}(const {{NATIVE_NAME}} &o)"
        "{{INIT_LIST}} {";
    code_ += "{{VEC_COPY}}}\n";
    code_ +=
        "inline {{NATIVE_NAME}} &{{NATIVE_NAME}}::operator="
        "({{NATIVE_NAME}} o) FLATBUFFERS_NOEXCEPT {";
    code_ += "{{SWAPS}}";
    code_ += "  return *this;\n}\n";
  }